

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O3

void Update_Chan_Algo3_LFO(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (length != 0 && CH->SLOT[3].Ecnt != 0x20000000) {
    uVar4 = 0;
    do {
      iVar2 = CH->SLOT[0].Fcnt;
      YM2612->in0 = iVar2;
      iVar3 = CH->SLOT[2].Fcnt;
      YM2612->in1 = iVar3;
      iVar5 = CH->SLOT[1].Fcnt;
      YM2612->in2 = iVar5;
      iVar9 = CH->SLOT[3].Fcnt;
      YM2612->in3 = iVar9;
      uVar6 = YM2612->LFO_FREQ_UP[uVar4] * CH->FMS;
      if (uVar6 < 0x200) {
        iVar2 = iVar2 + CH->SLOT[0].Finc;
        iVar3 = iVar3 + CH->SLOT[2].Finc;
        iVar5 = iVar5 + CH->SLOT[1].Finc;
        iVar8 = CH->SLOT[3].Finc;
      }
      else {
        iVar7 = (int)uVar6 >> 9;
        iVar8 = CH->SLOT[0].Finc;
        iVar1 = CH->SLOT[1].Finc;
        iVar2 = iVar2 + iVar8 + (iVar8 * iVar7 >> 9);
        iVar8 = CH->SLOT[2].Finc;
        iVar3 = iVar3 + iVar8 + (iVar8 * iVar7 >> 9);
        iVar5 = iVar5 + iVar1 + (iVar1 * iVar7 >> 9);
        iVar8 = CH->SLOT[3].Finc;
        iVar8 = (iVar7 * iVar8 >> 9) + iVar8;
      }
      CH->SLOT[0].Fcnt = iVar2;
      CH->SLOT[2].Fcnt = iVar3;
      CH->SLOT[1].Fcnt = iVar5;
      CH->SLOT[3].Fcnt = iVar8 + iVar9;
      iVar2 = YM2612->LFO_ENV_UP[uVar4];
      iVar3 = CH->SLOT[0].Ecnt;
      uVar6 = CH->SLOT[0].TLL + ENV_TAB[iVar3 >> 0x10];
      if ((CH->SLOT[0].SEG & 4) == 0) {
        iVar5 = uVar6 + (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f));
      }
      else {
        iVar5 = 0;
        if ((int)uVar6 < 0x1000) {
          iVar5 = (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f)) + (uVar6 ^ 0xfff);
        }
      }
      YM2612->en0 = iVar5;
      iVar5 = CH->SLOT[2].Ecnt;
      uVar6 = CH->SLOT[2].TLL + ENV_TAB[iVar5 >> 0x10];
      if ((CH->SLOT[2].SEG & 4) == 0) {
        iVar9 = uVar6 + (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f));
      }
      else {
        iVar9 = 0;
        if ((int)uVar6 < 0x1000) {
          iVar9 = (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f)) + (uVar6 ^ 0xfff);
        }
      }
      YM2612->en1 = iVar9;
      uVar6 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
      if ((CH->SLOT[1].SEG & 4) == 0) {
        iVar9 = uVar6 + (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f));
      }
      else {
        iVar9 = 0;
        if ((int)uVar6 < 0x1000) {
          iVar9 = (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f)) + (uVar6 ^ 0xfff);
        }
      }
      YM2612->en2 = iVar9;
      uVar6 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
      if ((CH->SLOT[3].SEG & 4) == 0) {
        iVar9 = uVar6 + (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f));
      }
      else {
        iVar9 = 0;
        if ((int)uVar6 < 0x1000) {
          iVar9 = (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f)) + (uVar6 ^ 0xfff);
        }
      }
      YM2612->en3 = iVar9;
      iVar3 = iVar3 + CH->SLOT[0].Einc;
      CH->SLOT[0].Ecnt = iVar3;
      if (CH->SLOT[0].Ecmp <= iVar3) {
        (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
        iVar5 = CH->SLOT[2].Ecnt;
      }
      iVar5 = iVar5 + CH->SLOT[2].Einc;
      CH->SLOT[2].Ecnt = iVar5;
      if (CH->SLOT[2].Ecmp <= iVar5) {
        (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
      }
      iVar2 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
      CH->SLOT[1].Ecnt = iVar2;
      if (CH->SLOT[1].Ecmp <= iVar2) {
        (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
      }
      iVar2 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
      CH->SLOT[3].Ecnt = iVar2;
      if (CH->SLOT[3].Ecmp <= iVar2) {
        (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
      }
      YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
      iVar2 = CH->S0_OUT[0];
      CH->S0_OUT[1] = iVar2;
      CH->S0_OUT[0] =
           *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                   (long)YM2612->en0 * 4);
      uVar6 = iVar2 + YM2612->in1;
      YM2612->in1 = uVar6;
      uVar6 = *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in2 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en2 * 4) +
              *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar6 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en1 * 4) + YM2612->in3;
      YM2612->in3 = uVar6;
      uVar6 = *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar6 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en3 * 4) >> 0xf;
      CH->OUTd = uVar6;
      (*buf)[uVar4] = (*buf)[uVar4] + (uVar6 & CH->LEFT);
      buf[1][uVar4] = buf[1][uVar4] + (CH->RIGHT & CH->OUTd);
      uVar4 = uVar4 + 1;
    } while (length != uVar4);
  }
  return;
}

Assistant:

static void Update_Chan_Algo3_LFO(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;
  int env_LFO, freq_LFO;

  if (CH->SLOT[S3].Ecnt == ENV_END)
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 3 LFO len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE_LFO
    GET_CURRENT_ENV_LFO
    UPDATE_ENV
    DO_ALGO_3
    DO_OUTPUT
  }
}